

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

err_t cvcPrint(int argc,char **argv)

{
  size_t sVar1;
  blob_t count;
  btok_cvc_t *cvc_00;
  undefined8 *in_RSI;
  int in_EDI;
  char *scope;
  btok_cvc_t *cvc;
  octet *cert;
  void *stack;
  size_t cert_len;
  octet *in_stack_00000030;
  err_t code;
  undefined4 in_stack_00000044;
  btok_cvc_t *in_stack_00000048;
  size_t in_stack_ffffffffffffffb8;
  char *pcVar2;
  char **in_stack_ffffffffffffffc8;
  size_t *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  long local_20;
  err_t local_4;
  
  pcVar2 = (char *)0x0;
  if ((in_EDI < 1) || (2 < in_EDI)) {
    local_4 = 0x25b;
  }
  else {
    if (in_EDI == 2) {
      pcVar2 = (char *)*in_RSI;
      sVar1 = strLen((char *)0x10f9ff);
      if ((sVar1 == 0) || (*pcVar2 != '-')) {
        return 0x25b;
      }
      pcVar2 = pcVar2 + 1;
    }
    local_4 = cmdFileValExist((int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((local_4 == 0) &&
       (local_4 = cmdFileReadAll(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                 (char *)in_stack_ffffffffffffffc8), local_4 == 0)) {
      count = blobCreate(in_stack_ffffffffffffffb8);
      local_4 = 0x6e;
      if (count != (blob_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        cvc_00 = (btok_cvc_t *)((long)count + local_20);
        local_4 = cmdFileReadAll(count,(size_t *)count,(char *)cvc_00);
        if (local_4 == 0) {
          local_4 = btokCVCUnwrap(in_stack_00000048,(octet *)CONCAT44(in_stack_00000044,argc),
                                  (size_t)argv,in_stack_00000030,cert_len);
          if (local_4 == 0) {
            local_4 = cmdCVCPrint(cvc_00,pcVar2);
            blobClose((blob_t)0x10fb81);
          }
          else {
            blobClose((blob_t)0x10fb5a);
          }
        }
        else {
          blobClose((blob_t)0x10fb1f);
        }
      }
    }
  }
  return local_4;
}

Assistant:

static err_t cvcPrint(int argc, char* argv[])
{
	err_t code;
	size_t cert_len;
	void* stack;
	octet* cert;
	btok_cvc_t* cvc;
	const char* scope = 0;
	// обработать опции
	if (argc < 1 || argc > 2)
		return ERR_CMD_PARAMS;
	if (argc == 2)
	{
		scope = argv[0];
		if (strLen(scope) < 1 || scope[0] != '-')
			return ERR_CMD_PARAMS;
		++scope, --argc, ++argv;
	}
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// определить длину сертификата
	code = cmdFileReadAll(0, &cert_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, cert_len + sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cert = (octet*)stack;
	cvc = (btok_cvc_t*)(cert + cert_len);
	// прочитать сертификат
	code = cmdFileReadAll(cert, &cert_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// разобрать сертификат
	code = btokCVCUnwrap(cvc, cert, cert_len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// печатать содержимое
	code = cmdCVCPrint(cvc, scope);
	// завершить
	cmdBlobClose(stack);
	return code;
}